

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O2

bool __thiscall Parsing::File::load(File *this)

{
  bool bVar1;
  string local_70;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_50,(string *)&this->_path);
  parseExt(this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string((string *)&local_70,(string *)&this->_path);
  parseName(&local_30,this,&local_70);
  std::__cxx11::string::operator=((string *)&this->_name,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_70);
  bVar1 = isFile(this);
  return bVar1;
}

Assistant:

bool File::load() noexcept
    {
        parseExt(_path);
        _name = parseName(_path);
        if (!isFile())
            return false;
        return true;
    }